

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O2

void jpc_pi_destroy(jpc_pi_t *pi)

{
  uint uVar1;
  uint uVar2;
  jpc_picomp_t *pjVar3;
  uint **ppuVar4;
  
  pjVar3 = pi->picomps;
  if (pjVar3 != (jpc_picomp_t *)0x0) {
    for (uVar1 = 0; uVar1 < pi->numcomps; uVar1 = uVar1 + 1) {
      if (pjVar3->pirlvls != (jpc_pirlvl_t *)0x0) {
        ppuVar4 = &pjVar3->pirlvls->prclyrnos;
        for (uVar2 = 0; uVar2 < pjVar3->numrlvls; uVar2 = uVar2 + 1) {
          if (*ppuVar4 != (uint *)0x0) {
            jas_free(*ppuVar4);
          }
          ppuVar4 = ppuVar4 + 4;
        }
        jas_free(pjVar3->pirlvls);
      }
      pjVar3 = pjVar3 + 1;
    }
    jas_free(pi->picomps);
  }
  if (pi->pchglist != (jpc_pchglist_t *)0x0) {
    jpc_pchglist_destroy(pi->pchglist);
  }
  jas_free(pi);
  return;
}

Assistant:

void jpc_pi_destroy(jpc_pi_t *pi)
{
	jpc_picomp_t *picomp;
	unsigned compno;
	if (pi->picomps) {
		for (compno = 0, picomp = pi->picomps; compno < pi->numcomps;
		  ++compno, ++picomp) {
			jpc_picomp_destroy(picomp);
		}
		jas_free(pi->picomps);
	}
	if (pi->pchglist) {
		jpc_pchglist_destroy(pi->pchglist);
	}
	jas_free(pi);
}